

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

void CalculateTimeInfo(PaAlsaStream *stream,PaStreamCallbackTimeInfo *timeInfo)

{
  snd_pcm_t *psVar1;
  long lVar2;
  size_t sVar3;
  snd_pcm_status_t *__s;
  snd_pcm_status_t *__s_00;
  snd_pcm_sframes_t sVar4;
  undefined8 uStack_80;
  snd_pcm_status_t local_78 [8];
  snd_pcm_sframes_t playback_delay;
  snd_pcm_sframes_t capture_delay;
  size_t __alsa_alloca_size_1;
  size_t __alsa_alloca_size;
  PaTime playback_time;
  PaTime capture_time;
  snd_timestamp_t playback_timestamp;
  snd_timestamp_t capture_timestamp;
  snd_pcm_status_t *playback_status;
  snd_pcm_status_t *capture_status;
  PaStreamCallbackTimeInfo *timeInfo_local;
  PaAlsaStream *stream_local;
  
  playback_time = 0.0;
  __alsa_alloca_size = 0;
  uStack_80 = 0x11afd9;
  sVar3 = (*(code *)alsa_snd_pcm_status_sizeof)();
  lVar2 = -(sVar3 + 0xf & 0xfffffffffffffff0);
  __s = local_78 + lVar2;
  __alsa_alloca_size_1 = sVar3;
  *(undefined8 *)(local_78 + lVar2 + -8) = 0x11b005;
  memset(__s,0,sVar3);
  *(undefined8 *)(local_78 + lVar2 + -8) = 0x11b010;
  sVar3 = (*(code *)alsa_snd_pcm_status_sizeof)();
  __s_00 = __s + -(sVar3 + 0xf & 0xfffffffffffffff0);
  capture_delay = sVar3;
  *(undefined8 *)(__s_00 + -8) = 0x11b03c;
  memset(__s_00,0,sVar3);
  if ((stream->capture).pcm != (snd_pcm_t *)0x0) {
    psVar1 = (stream->capture).pcm;
    *(undefined8 *)(__s_00 + -8) = 0x11b066;
    (*alsa_snd_pcm_status)(psVar1,__s);
    *(undefined8 *)(__s_00 + -8) = 0x11b077;
    (*(code *)alsa_snd_pcm_status_get_tstamp)(__s,&playback_timestamp.tv_usec);
    playback_time =
         (double)playback_timestamp.tv_usec + (double)capture_timestamp.tv_sec / 1000000.0;
    timeInfo->currentTime = playback_time;
    *(undefined8 *)(__s_00 + -8) = 0x11b0b3;
    playback_delay = (*alsa_snd_pcm_status_get_delay)(__s);
    timeInfo->inputBufferAdcTime =
         timeInfo->currentTime -
         (double)playback_delay / (stream->streamRepresentation).streamInfo.sampleRate;
  }
  if ((stream->playback).pcm != (snd_pcm_t *)0x0) {
    psVar1 = (stream->playback).pcm;
    *(undefined8 *)(__s_00 + -8) = 0x11b105;
    (*alsa_snd_pcm_status)(psVar1,__s_00);
    *(undefined8 *)(__s_00 + -8) = 0x11b116;
    (*(code *)alsa_snd_pcm_status_get_tstamp)(__s_00,&capture_time);
    __alsa_alloca_size =
         (size_t)((double)(long)capture_time + (double)playback_timestamp.tv_sec / 1000000.0);
    if ((stream->capture).pcm == (snd_pcm_t *)0x0) {
      timeInfo->currentTime = (PaTime)__alsa_alloca_size;
    }
    *(undefined8 *)(__s_00 + -8) = 0x11b187;
    sVar4 = (*alsa_snd_pcm_status_get_delay)(__s_00);
    timeInfo->outputBufferDacTime =
         timeInfo->currentTime +
         (double)sVar4 / (stream->streamRepresentation).streamInfo.sampleRate;
  }
  return;
}

Assistant:

static void CalculateTimeInfo( PaAlsaStream *stream, PaStreamCallbackTimeInfo *timeInfo )
{
    snd_pcm_status_t *capture_status, *playback_status;
    snd_timestamp_t capture_timestamp, playback_timestamp;
    PaTime capture_time = 0., playback_time = 0.;

    alsa_snd_pcm_status_alloca( &capture_status );
    alsa_snd_pcm_status_alloca( &playback_status );

    if( stream->capture.pcm )
    {
        snd_pcm_sframes_t capture_delay;

        alsa_snd_pcm_status( stream->capture.pcm, capture_status );
        alsa_snd_pcm_status_get_tstamp( capture_status, &capture_timestamp );

        capture_time = capture_timestamp.tv_sec +
            ( (PaTime)capture_timestamp.tv_usec / 1000000.0 );
        timeInfo->currentTime = capture_time;

        capture_delay = alsa_snd_pcm_status_get_delay( capture_status );
        timeInfo->inputBufferAdcTime = timeInfo->currentTime -
            (PaTime)capture_delay / stream->streamRepresentation.streamInfo.sampleRate;
    }
    if( stream->playback.pcm )
    {
        snd_pcm_sframes_t playback_delay;

        alsa_snd_pcm_status( stream->playback.pcm, playback_status );
        alsa_snd_pcm_status_get_tstamp( playback_status, &playback_timestamp );

        playback_time = playback_timestamp.tv_sec +
            ((PaTime)playback_timestamp.tv_usec / 1000000.0);

        if( stream->capture.pcm ) /* Full duplex */
        {
            /* Hmm, we have both a playback and a capture timestamp.
             * Hopefully they are the same... */
            if( fabs( capture_time - playback_time ) > 0.01 )
                PA_DEBUG(( "Capture time and playback time differ by %f\n", fabs( capture_time-playback_time ) ));
        }
        else
            timeInfo->currentTime = playback_time;

        playback_delay = alsa_snd_pcm_status_get_delay( playback_status );
        timeInfo->outputBufferDacTime = timeInfo->currentTime +
            (PaTime)playback_delay / stream->streamRepresentation.streamInfo.sampleRate;
    }
}